

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

string * __thiscall
BasePort::GetHardwareVersionString_abi_cxx11_
          (string *__return_storage_ptr__,BasePort *this,uchar boardId)

{
  __uint32_t _Var1;
  ulong local_28;
  unsigned_long hver;
  BasePort *pBStack_18;
  uchar boardId_local;
  BasePort *this_local;
  string *hStr;
  
  hver._6_1_ = 0;
  hver._7_1_ = boardId;
  pBStack_18 = this;
  this_local = (BasePort *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((hver._7_1_ < 0x10) && (this->HardwareVersion[hver._7_1_] != 0)) {
    _Var1 = __bswap_32((__uint32_t)this->HardwareVersion[hver._7_1_]);
    local_28 = (ulong)_Var1;
    std::__cxx11::string::assign((char *)__return_storage_ptr__,(ulong)&local_28);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Invalid");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::GetHardwareVersionString(unsigned char boardId) const
{
    std::string hStr;
    if ((boardId < BoardIO::MAX_BOARDS) && HardwareVersion[boardId]) {
        unsigned long hver = bswap_32(HardwareVersion[boardId]);
        hStr.assign(reinterpret_cast<const char *>(&hver), sizeof(unsigned long));
        hStr.resize(4);
    } else {
        hStr = "Invalid";
    }
    return hStr;
}